

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::
~basic_memory_buffer(basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this)

{
  uint *puVar1;
  
  (this->super_buffer<unsigned_int>)._vptr_buffer = (_func_int **)&PTR_grow_00261a78;
  puVar1 = (this->super_buffer<unsigned_int>).ptr_;
  if (puVar1 != this->store_) {
    operator_delete(puVar1,(this->super_buffer<unsigned_int>).capacity_ << 2);
  }
  operator_delete(this,0xa0);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }